

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Cpu.cpp
# Opt level: O2

void __thiscall Kss_Cpu::Kss_Cpu(Kss_Cpu *this)

{
  ulong uVar1;
  uint8_t uVar3;
  uint uVar4;
  int p;
  uint uVar5;
  ulong uVar6;
  ulong uVar2;
  
  this->state = &this->state_;
  uVar2 = 0x100;
  while (uVar1 = uVar2 - 1, uVar2 != 0) {
    uVar4 = 1;
    uVar6 = uVar1 & 0xffffffff;
    while( true ) {
      uVar5 = (uint)uVar6;
      if (uVar5 == 0) break;
      uVar4 = uVar4 ^ uVar5;
      uVar6 = (ulong)(uint)((int)uVar5 >> 1);
    }
    uVar3 = ((byte)uVar1 & 0xa8) + ((byte)uVar4 & 1) * '\x04';
    this->szpc[uVar1] = uVar3;
    this->szpc[uVar2 + 0xff] = uVar3 + '\x01';
    uVar2 = uVar1;
  }
  this->szpc[0] = this->szpc[0] | 0x40;
  this->szpc[0x100] = this->szpc[0x100] | 0x40;
  return;
}

Assistant:

Kss_Cpu::Kss_Cpu()
{
	state = &state_;
	
	for ( int i = 0x100; --i >= 0; )
	{
		int even = 1;
		for ( int p = i; p; p >>= 1 )
			even ^= p;
		int n = (i & (S80 | F20 | F08)) | ((even & 1) * P04);
		szpc [i] = n;
		szpc [i + 0x100] = n | C01;
	}
	szpc [0x000] |= Z40;
	szpc [0x100] |= Z40;
}